

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::EliminateDeadMembersPass::Process(EliminateDeadMembersPass *this)

{
  bool bVar1;
  Status SVar2;
  FeatureManager *pFVar3;
  
  pFVar3 = IRContext::get_feature_mgr((this->super_MemPass).super_Pass.context_);
  bVar1 = EnumSet<spv::Capability>::contains(&pFVar3->capabilities_,CapabilityShader);
  if (bVar1) {
    FindLiveMembers(this);
    bVar1 = RemoveDeadMembers(this);
    SVar2 = bVar1 ^ SuccessWithoutChange;
  }
  else {
    SVar2 = SuccessWithoutChange;
  }
  return SVar2;
}

Assistant:

Pass::Status EliminateDeadMembersPass::Process() {
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return Status::SuccessWithoutChange;

  FindLiveMembers();
  if (RemoveDeadMembers()) {
    return Status::SuccessWithChange;
  }
  return Status::SuccessWithoutChange;
}